

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O1

pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> __thiscall
QTriangulator<unsigned_short>::ComplexToSimple::bounds(ComplexToSimple *this,QPodPoint *point)

{
  int iVar1;
  Edge *pEVar2;
  QPodPoint *pQVar3;
  Node **ppNVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *pNVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> pVar13;
  
  pEVar2 = (this->m_edges).buffer;
  pNVar5 = (Node *)0x0;
  pNVar7 = (this->m_edgeList).root;
  pNVar8 = (Node *)0x0;
  do {
    pNVar6 = pNVar7;
    if (pNVar6 == (Node *)0x0) {
      pNVar7 = (Node *)0x0;
      pNVar6 = pNVar5;
      pNVar9 = pNVar8;
      break;
    }
    iVar1 = pNVar6->data;
    pQVar3 = (this->m_parent->m_vertices).buffer;
    lVar10 = ((long)point->x - (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x)
             * ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].y -
               (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y);
    lVar11 = ((long)point->y - (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y)
             * ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].x -
               (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x);
    pNVar7 = pNVar6;
    pNVar9 = pNVar6;
    if (lVar11 - lVar10 != 0) {
      ppNVar4 = &pNVar6->left;
      pNVar6 = pNVar5;
      pNVar7 = ppNVar4[lVar10 <= lVar11];
      pNVar9 = pNVar8;
    }
    pNVar5 = pNVar6;
    pNVar8 = pNVar9;
  } while (lVar11 - lVar10 != 0);
  if (pNVar7 != (Node *)0x0) {
    pNVar5 = pNVar6->left;
    if (pNVar5 != (Node *)0x0) {
      pEVar2 = (this->m_edges).buffer;
      pQVar3 = (this->m_parent->m_vertices).buffer;
      do {
        iVar1 = pNVar5->data;
        bVar12 = ((long)point->y -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) *
                 ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].x -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) -
                 ((long)point->x -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) *
                 ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].y -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) != 0;
        if (!bVar12) {
          pNVar6 = pNVar5;
        }
        pNVar5 = (&pNVar5->left)[bVar12];
      } while (pNVar5 != (Node *)0x0);
    }
    pNVar5 = pNVar9->right;
    if (pNVar5 != (Node *)0x0) {
      pEVar2 = (this->m_edges).buffer;
      pQVar3 = (this->m_parent->m_vertices).buffer;
      do {
        iVar1 = pNVar5->data;
        bVar12 = ((long)point->y -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) *
                 ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].x -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) -
                 ((long)point->x -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) *
                 ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].y -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) == 0;
        if (bVar12) {
          pNVar9 = pNVar5;
        }
        pNVar5 = (&pNVar5->left)[bVar12];
      } while (pNVar5 != (Node *)0x0);
    }
  }
  pVar13.second = pNVar9;
  pVar13.first = pNVar6;
  return pVar13;
}

Assistant:

std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> QTriangulator<T>::ComplexToSimple::bounds(const QPodPoint &point) const
{
    QRBTree<int>::Node *current = m_edgeList.root;
    std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> result(nullptr, nullptr);
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        if (d == 0) {
            result.first = result.second = current;
            break;
        }
        current = (d < 0 ? current->left : current->right);
    }
    if (current == nullptr)
        return result;

    current = result.first->left;
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        Q_ASSERT(d >= 0);
        if (d == 0) {
            result.first = current;
            current = current->left;
        } else {
            current = current->right;
        }
    }

    current = result.second->right;
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        Q_ASSERT(d <= 0);
        if (d == 0) {
            result.second = current;
            current = current->right;
        } else {
            current = current->left;
        }
    }

    return result;
}